

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skip_tests.cpp
# Opt level: O0

void __thiscall iu_SkipTest_x_iutest_x_Failed_Test::Body(iu_SkipTest_x_iutest_x_Failed_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionHelper local_5a8;
  Fixed local_578;
  int local_3f0 [2];
  undefined1 local_3e8 [8];
  AssertionResult iutest_ar_1;
  Fixed local_390;
  AssertionHelper local_208;
  Fixed local_1d8;
  int local_40 [2];
  undefined1 local_38 [8];
  AssertionResult iutest_ar;
  iu_SkipTest_x_iutest_x_Failed_Test *this_local;
  
  iutest_ar._32_8_ = this;
  iutest::detail::AlwaysZero();
  local_40[1] = 2;
  local_40[0] = 3;
  iutest::internal::backward::EqHelper<false>::Compare<int>
            ((AssertionResult *)local_38,"2","3",local_40 + 1,local_40);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    memset(&local_1d8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1d8);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_38);
    iutest::AssertionHelper::AssertionHelper
              (&local_208,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/skip_tests.cpp"
               ,0x22,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_208,&local_1d8);
    iutest::AssertionHelper::~AssertionHelper(&local_208);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1d8);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  iutest::detail::AlwaysZero();
  bVar1 = iutest::detail::AlwaysTrue();
  if (bVar1) {
    memset(&local_390,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_390);
    bVar1 = iutest::UnitTestImpl::SkipTest();
    pcVar2 = "Skipped. but already failed. ";
    if (bVar1) {
      pcVar2 = "Skipped. ";
    }
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_1.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/skip_tests.cpp"
               ,0x23,pcVar2,kSkip);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_1.m_result,&local_390);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_1.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_390);
  }
  else {
    skip_check = false;
    iutest::detail::AlwaysZero();
    local_3f0[1] = 2;
    local_3f0[0] = 3;
    iutest::internal::backward::EqHelper<false>::Compare<int>
              ((AssertionResult *)local_3e8,"2","3",local_3f0 + 1,local_3f0);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e8);
    if (!bVar1) {
      memset(&local_578,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_578);
      pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_3e8);
      iutest::AssertionHelper::AssertionHelper
                (&local_5a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/skip_tests.cpp"
                 ,0x25,pcVar2,kNonFatalFailure);
      iutest::AssertionHelper::operator=(&local_5a8,&local_578);
      iutest::AssertionHelper::~AssertionHelper(&local_5a8);
      iutest::AssertionHelper::Fixed::~Fixed(&local_578);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_3e8);
  }
  return;
}

Assistant:

IUTEST(SkipTest, Failed)
{
    IUTEST_EXPECT_EQ(2, 3);
    IUTEST_SKIP();
    skip_check = false;
    IUTEST_EXPECT_EQ(2, 3);
}